

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::DrawIndirectBase::DataCompare<unsigned_int>
          (DrawIndirectBase *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *dataRef,
          uint widthRef,uint heightRef,vector<unsigned_int,_std::allocator<unsigned_int>_> *dataTest
          ,uint widthTest,uint heightTest,uint offsetYRef,uint offsetYTest)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  _func_int **pp_Var4;
  bool bVar5;
  runtime_error *this_00;
  undefined4 in_register_0000000c;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  DIResult status;
  long local_358;
  undefined1 local_338 [8];
  ostream local_330;
  undefined1 local_1b8 [384];
  long local_38;
  
  plVar6 = (long *)CONCAT44(in_register_0000000c,heightRef);
  uVar13 = (uint)dataRef;
  if ((ulong)((long)(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl -
              (long)(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper >> 2) <
      (ulong)(widthRef * uVar13)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid reference buffer resolution!");
  }
  else {
    uVar12 = (uint)dataTest;
    if ((ulong)(widthTest * uVar12) <= (ulong)(plVar6[1] - *plVar6 >> 2)) {
      if (widthTest < widthRef) {
        widthRef = widthTest;
      }
      if (widthRef != 0) {
        uVar11 = (ulong)dataRef & 0xffffffff;
        if (uVar12 < uVar13) {
          uVar11 = (ulong)dataTest & 0xffffffff;
        }
        bVar14 = (int)uVar11 != 0;
        uVar12 = offsetYRef * uVar12;
        uVar13 = heightTest * uVar13;
        uVar8 = 0;
        pvVar9 = dataRef;
        pvVar10 = dataTest;
        do {
          bVar5 = bVar14;
          if (uVar11 != 0) {
            pp_Var4 = (this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper;
            if (*(int *)((long)pp_Var4 + (ulong)(((int)uVar8 + heightTest) * (int)pvVar9) * 4) ==
                *(int *)(*plVar6 + (ulong)((offsetYRef + (int)uVar8) * (int)pvVar10) * 4)) {
              uVar7 = 0;
              do {
                if (uVar11 - 1 == uVar7) {
                  bVar5 = false;
                  goto LAB_00b8e4c0;
                }
                lVar2 = uVar7 * 4;
                uVar1 = uVar7 + 1;
                lVar3 = uVar7 * 4;
                uVar7 = uVar1;
              } while (*(int *)((long)pp_Var4 + lVar2 + (ulong)uVar13 * 4 + 4) ==
                       *(int *)(*plVar6 + (ulong)uVar12 * 4 + 4 + lVar3));
              bVar5 = uVar1 < uVar11;
            }
            local_1b8[0] = false;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
            local_38 = -1;
            local_338[0] = (DILogger)0x0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
            if (local_338[0] == (DILogger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_330,"Compare failed: different values [x: ",0x25);
            }
            if (local_338[0] == (DILogger)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)&local_330);
            }
            if (local_338[0] == (DILogger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(&local_330,", y: ",5);
            }
            if (local_338[0] == (DILogger)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)&local_330);
            }
            if (local_338[0] == (DILogger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(&local_330,", reference: ",0xd);
            }
            if (local_338[0] == (DILogger)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)&local_330);
            }
            glcts::(anonymous_namespace)::DILogger::operator<<
                      ((DILogger *)local_338,(char (*) [9])", test: ");
            if (local_338[0] == (DILogger)0x0) {
              std::ostream::_M_insert<unsigned_long>((ulong)&local_330);
            }
            glcts::(anonymous_namespace)::DILogger::operator<<
                      ((DILogger *)local_338,(char (*) [2])0x1a770fa);
            DILogger::~DILogger((DILogger *)local_338);
            local_358 = local_38;
            DILogger::~DILogger((DILogger *)local_1b8);
            pvVar10 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      ((ulong)dataTest & 0xffffffff);
            pvVar9 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     ((ulong)dataRef & 0xffffffff);
          }
LAB_00b8e4c0:
          if (bVar5) {
            return local_358;
          }
          uVar8 = uVar8 + 1;
          uVar12 = uVar12 + (int)pvVar10;
          uVar13 = uVar13 + (int)pvVar9;
        } while (uVar8 != widthRef);
      }
      return 0;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid test buffer resolution!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

long DataCompare(const std::vector<T>& dataRef, unsigned int widthRef, unsigned int heightRef,
					 const std::vector<T>& dataTest, unsigned int widthTest, unsigned int heightTest,
					 unsigned offsetYRef = 0, unsigned offsetYTest = 0)
	{
		if (widthRef * heightRef > dataRef.size())
			throw std::runtime_error("Invalid reference buffer resolution!");

		if (widthTest * heightTest > dataTest.size())
			throw std::runtime_error("Invalid test buffer resolution!");

		unsigned int width  = std::min(widthRef, widthTest);
		unsigned int height = std::min(heightRef, heightTest);

		for (unsigned int i = 0; i < height; ++i)
		{
			unsigned int offsetRef  = (i + offsetYRef) * widthRef;
			unsigned int offsetTest = (i + offsetYTest) * widthTest;

			for (size_t j = 0; j < width; ++j)
			{
				if (dataRef[offsetRef + j] != dataTest[offsetTest + j])
				{
					DIResult status;
					status.error() << "Compare failed: different values [x: " << j << ", y: " << i + offsetYTest
								   << ", reference: " << dataRef[offsetRef + j]
								   << ", test: " << dataTest[offsetTest + j] << "]";
					return status.code();
				}
			}
		}

		return NO_ERROR;
	}